

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O3

DdNode * Cudd_addPlus(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  
  pDVar1 = *f;
  pDVar2 = *g;
  if (pDVar1 != dd->zero) {
    if (pDVar2 == dd->zero) {
      return pDVar1;
    }
    if ((pDVar1->index == 0x7fffffff) && (pDVar2->index == 0x7fffffff)) {
      pDVar1 = cuddUniqueConst(dd,(pDVar1->type).value + (pDVar2->type).value);
      return pDVar1;
    }
    if (pDVar2 < pDVar1) {
      *f = pDVar2;
      *g = pDVar1;
    }
    pDVar2 = (DdNode *)0x0;
  }
  return pDVar2;
}

Assistant:

DdNode *
Cudd_addPlus(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *res;
    DdNode *F, *G;
    CUDD_VALUE_TYPE value;

    F = *f; G = *g;
    if (F == DD_ZERO(dd)) return(G);
    if (G == DD_ZERO(dd)) return(F);
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        value = cuddV(F)+cuddV(G);
        res = cuddUniqueConst(dd,value);
        return(res);
    }
    if (F > G) { /* swap f and g */
        *f = G;
        *g = F;
    }
    return(NULL);

}